

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Packet.cpp
# Opt level: O2

Packet * __thiscall mognetwork::Packet::operator<<(Packet *this,uint32_t data)

{
  uint32_t write;
  
  write = data >> 0x18 | (data & 0xff0000) >> 8 | (data & 0xff00) << 8 | data << 0x18;
  push(this,&write,4);
  return this;
}

Assistant:

Packet& Packet::operator<<(uint32_t data)
  {
    uint32_t write = htonl(data);
    push(&write, sizeof(write));
    return (*this);
  }